

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux_test.cpp
# Opt level: O2

void __thiscall license::test::read_disk_id::test_method(read_disk_id *this)

{
  pointer paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int i;
  LCC_API_VIRTUALIZATION_SUMMARY LVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  pointer __src;
  byte bVar9;
  bool bVar10;
  FUNCTION_RETURN result;
  undefined **local_808;
  ulong local_800;
  shared_count sStack_7f8;
  char *local_7f0;
  vector<DiskInfo,_std::allocator<DiskInfo>_> disk_infos;
  byte local_7b8 [8];
  undefined8 local_7b0;
  shared_count sStack_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  ExecutionEnvironment exec_env;
  anon_struct_1296_7_5326303c disk_info;
  
  os::ExecutionEnvironment::ExecutionEnvironment(&exec_env);
  LVar5 = os::ExecutionEnvironment::virtualization(&exec_env);
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  result = getDiskInfos(&disk_infos);
  if ((LVar5 & ~VM) == NONE) {
    local_630 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_628 = "";
    local_640 = &boost::unit_test::basic_cstring<char_const>::null;
    local_638 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_630,0x1b);
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8388;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7ba9;
    local_650 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_648 = "";
    local_808 = (undefined **)((ulong)local_808 & 0xffffffff00000000);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,FUNCTION_RETURN,FUNCTION_RETURN>
              (&disk_info,&local_650,0x1b,1,2,&result,"result",&local_808,"FUNC_RET_OK");
    local_660 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_658 = "";
    local_670 = &boost::unit_test::basic_cstring<char_const>::null;
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_660,0x1c);
    local_808 = (undefined **)
                CONCAT71(local_808._1_7_,
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish !=
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_800 = 0;
    sStack_7f8.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8418;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7bf4;
    local_680 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_678 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_7f8);
    paVar1 = disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar9 = 0;
    bVar8 = 0;
    bVar7 = 0;
    for (__src = disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                 super__Vector_impl_data._M_start; __src != paVar1; __src = __src + 1) {
      memcpy(&disk_info,__src,0x510);
      bVar4 = disk_info.preferred;
      bVar3 = disk_info.label_initialized;
      bVar2 = disk_info.sn_initialized;
      if ((disk_info.sn_initialized & 1U) != 0) {
        bVar10 = true;
        uVar6 = 0;
        while ((uVar6 < 8 && (bVar10))) {
          bVar10 = disk_info.disk_sn[uVar6] == '\0';
          uVar6 = uVar6 + 1;
        }
        local_780 = 
        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
        ;
        local_778 = "";
        local_790 = &boost::unit_test::basic_cstring<char_const>::null;
        local_788 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_780,0x2b,&local_790
                  );
        local_7b8[0] = ~bVar10 & 1;
        local_7b0 = 0;
        sStack_7a8.pi_ = (sp_counted_base *)0x0;
        local_800 = local_800 & 0xffffffffffffff00;
        local_808 = &PTR__lazy_ostream_001c8458;
        sStack_7f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_7f0 = "disksn is not all zero";
        local_7a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
        ;
        local_798 = "";
        boost::test_tools::tt_detail::report_assertion(local_7b8,&local_808,&local_7a0,0x2b,1,1,0);
        boost::detail::shared_count::~shared_count(&sStack_7a8);
      }
      bVar8 = bVar8 | bVar2;
      bVar9 = bVar9 | bVar4;
      bVar7 = bVar7 | bVar3;
    }
    local_690 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_688 = "";
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_690,0x2e);
    local_808 = (undefined **)(CONCAT71(local_808._1_7_,bVar8) & 0xffffffffffffff01);
    local_800 = 0;
    sStack_7f8.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8498;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7c26;
    local_6b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6a8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_7f8);
    local_6c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6b8 = "";
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6c0,0x2f);
    local_808 = (undefined **)(CONCAT71(local_808._1_7_,bVar7) & 0xffffffffffffff01);
    local_800 = 0;
    sStack_7f8.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c84d8;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7c3f;
    local_6e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6d8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_7f8);
    local_6f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_6e8 = "";
    local_700 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6f0,0x30);
    local_808 = (undefined **)(CONCAT71(local_808._1_7_,bVar9) & 0xffffffffffffff01);
    local_800 = 0;
    sStack_7f8.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8518;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7c58;
    local_710 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_708 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    if (LVar5 != CONTAINER) goto LAB_0011c48a;
    local_720 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_718 = "";
    local_730 = &boost::unit_test::basic_cstring<char_const>::null;
    local_728 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_720,0x33);
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8388;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7ba9;
    local_740 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_738 = "";
    local_808 = (undefined **)CONCAT44(local_808._4_4_,1);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,FUNCTION_RETURN,FUNCTION_RETURN>
              (&disk_info,&local_740,0x33,1,2,&result,"result",&local_808,"FUNC_RET_NOT_AVAIL");
    local_750 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_748 = "";
    local_760 = &boost::unit_test::basic_cstring<char_const>::null;
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_750,0x34);
    local_808 = (undefined **)
                CONCAT71(local_808._1_7_,
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish ==
                         disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_800 = 0;
    sStack_7f8.pi_ = (sp_counted_base *)0x0;
    disk_info.device[4] = '\0';
    disk_info._0_8_ = &PTR__lazy_ostream_001c8558;
    disk_info.device._12_8_ = boost::unit_test::lazy_ostream::inst;
    disk_info.device._20_8_ = anon_var_dwarf_7c8a;
    local_770 = 
    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
    ;
    local_768 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_7f8);
LAB_0011c48a:
  std::_Vector_base<DiskInfo,_std::allocator<DiskInfo>_>::~_Vector_base
            (&disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>);
  os::ExecutionEnvironment::~ExecutionEnvironment(&exec_env);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(read_disk_id) {
	os::ExecutionEnvironment exec_env;
	LCC_API_VIRTUALIZATION_SUMMARY virt = exec_env.virtualization();
	vector<DiskInfo> disk_infos;
	FUNCTION_RETURN result = getDiskInfos(disk_infos);
	if (virt == LCC_API_VIRTUALIZATION_SUMMARY::NONE || virt == LCC_API_VIRTUALIZATION_SUMMARY::VM) {
		BOOST_CHECK_EQUAL(result, FUNC_RET_OK);
		BOOST_REQUIRE_MESSAGE(disk_infos.size() > 0, "Found some disk");
		bool preferred_found = false;
		bool uuid_found = false;
		bool label_found = false;

		for (auto disk_info : disk_infos) {
			uuid_found = uuid_found || disk_info.sn_initialized;
			preferred_found = preferred_found || disk_info.preferred;
			label_found = label_found || disk_info.label_initialized;

			if (disk_info.sn_initialized) {
				bool all_zero = true;
				for (int i = 0; i < sizeof(disk_info.disk_sn) && all_zero; i++) {
					all_zero = (disk_info.disk_sn[i] == 0);
				}
				BOOST_CHECK_MESSAGE(!all_zero, "disksn is not all zero");
			}
		}
		BOOST_CHECK_MESSAGE(uuid_found, "At least one UUID initialized");
		BOOST_CHECK_MESSAGE(label_found, "At least one label found");
		BOOST_CHECK_MESSAGE(preferred_found, "At least one standard mounted file system");
	} else if (virt == LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER) {
		// in docker or lxc diskInfo is very likely not to find any good disk.
		BOOST_CHECK_EQUAL(result, FUNC_RET_NOT_AVAIL);
		BOOST_REQUIRE_MESSAGE(disk_infos.size() == 0, "Found no disk");
	}
}